

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::NegativeApiCase::iterate(NegativeApiCase *this)

{
  ObjectTraits **this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  NotSupportedError *pNVar3;
  char *description;
  ObjectWrapper *this_01;
  GLint maxStride;
  allocator<char> local_1e1;
  CallLogWrapper gl;
  GLint maxOffset;
  undefined4 uStack_1c4;
  GLenum local_1c0;
  GLuint local_1b8;
  VertexArray vao;
  Buffer buffer;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).m_context)->m_testCtx->m_log);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  switch(this->m_caseType) {
  case CASE_LARGE_OFFSET:
    _maxOffset = (code *)CONCAT44(uStack_1c4,0xffffffff);
    glu::CallLogWrapper::glGetIntegerv(&gl,0x82d9,&maxOffset);
    GVar2 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5b4);
    if ((~maxOffset & 0x7fffffffU) == 0) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"Implementation supports all offsets",
                 (allocator<char> *)&maxStride);
      tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)&buffer);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glVertexAttribFormat(&gl,0,4,0x1406,'\0',maxOffset + 1);
    break;
  case CASE_LARGE_STRIDE:
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&maxOffset,
               ((this->super_TestCase).m_context)->m_renderCtx);
    maxStride = -1;
    glu::CallLogWrapper::glGetIntegerv(&gl,0x82e5,&maxStride);
    GVar2 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5c7);
    if ((~maxStride & 0x7fffffffU) == 0) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"Implementation supports all strides",&local_1e1);
      tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)&buffer);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glBindVertexBuffer(&gl,0,local_1b8,0,maxStride + 1);
    this_01 = (ObjectWrapper *)&maxOffset;
    goto LAB_004e6da3;
  case CASE_NEGATIVE_STRIDE:
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              (&buffer,((this->super_TestCase).m_context)->m_renderCtx);
    glu::CallLogWrapper::glBindVertexBuffer(&gl,0,buffer.super_ObjectWrapper.m_object,0,-0x14);
    goto LAB_004e6d23;
  case CASE_NEGATIVE_OFFSET:
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              (&buffer,((this->super_TestCase).m_context)->m_renderCtx);
    glu::CallLogWrapper::glBindVertexBuffer(&gl,0,buffer.super_ObjectWrapper.m_object,-0x14,0);
LAB_004e6d23:
    this_01 = &buffer.super_ObjectWrapper;
LAB_004e6da3:
    glu::ObjectWrapper::~ObjectWrapper(this_01);
    break;
  case CASE_INVALID_ATTR:
    _maxOffset = (code *)CONCAT44(uStack_1c4,0xffffffff);
    glu::CallLogWrapper::glGetIntegerv(&gl,0x8869,&maxOffset);
    GVar2 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5e7);
    if ((~maxOffset & 0x7fffffffU) == 0) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"Implementation supports any attribute index",
                 (allocator<char> *)&maxStride);
      tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)&buffer);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glVertexAttribBinding(&gl,maxOffset + 1,0);
    break;
  case CASE_INVALID_BINDING:
    _maxOffset = (code *)CONCAT44(uStack_1c4,0xffffffff);
    glu::CallLogWrapper::glGetIntegerv(&gl,0x82da,&maxOffset);
    GVar2 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5f9);
    if ((~maxOffset & 0x7fffffffU) == 0) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"Implementation supports any binding",
                 (allocator<char> *)&maxStride);
      tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)&buffer);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glVertexAttribBinding(&gl,0,maxOffset + 1);
  }
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0x501) {
    buffer.super_ObjectWrapper.m_gl =
         (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &buffer.super_ObjectWrapper.m_traits;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"ERROR! Expected GL_INVALID_VALUE, got ");
    _maxOffset = glu::getErrorName;
    local_1c0 = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&maxOffset,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    description = "Invalid error";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar2 != 0x501),
             description);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

NegativeApiCase::IterateResult NegativeApiCase::iterate (void)
{
	glw::GLenum			error;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	glu::VertexArray	vao		(m_context.getRenderContext());

	gl.enableLogging(true);
	gl.glBindVertexArray(*vao);

	switch (m_caseType)
	{
		case CASE_LARGE_OFFSET:
		{
			glw::GLint	maxOffset	= -1;
			glw::GLint	largeOffset;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &maxOffset);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeOffset = maxOffset + 1;

			// skip if maximum unsigned or signed values
			if (maxOffset == -1 || maxOffset == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports all offsets");

			gl.glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, largeOffset);
			break;
		}

		case CASE_LARGE_STRIDE:
		{
			glu::Buffer buffer		(m_context.getRenderContext());
			glw::GLint	maxStride	= -1;
			glw::GLint	largeStride;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &maxStride);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeStride = maxStride + 1;

			// skip if maximum unsigned or signed values
			if (maxStride == -1 || maxStride == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports all strides");

			gl.glBindVertexBuffer(0, *buffer, 0, largeStride);
			break;
		}

		case CASE_NEGATIVE_STRIDE:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, 0, -20);
			break;
		}

		case CASE_NEGATIVE_OFFSET:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, -20, 0);
			break;
		}

		case CASE_INVALID_ATTR:
		{
			glw::GLint maxIndex = -1;
			glw::GLint largeIndex;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxIndex);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeIndex = maxIndex + 1;

			// skip if maximum unsigned or signed values
			if (maxIndex == -1 || maxIndex == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports any attribute index");

			gl.glVertexAttribBinding(largeIndex, 0);
			break;
		}

		case CASE_INVALID_BINDING:
		{
			glw::GLint maxBindings = -1;
			glw::GLint largeBinding;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &maxBindings);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeBinding = maxBindings + 1;

			// skip if maximum unsigned or signed values
			if (maxBindings == -1 || maxBindings == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports any binding");

			gl.glVertexAttribBinding(0, largeBinding);
			break;
		}

		default:
			DE_ASSERT(false);
	}

	error = gl.glGetError();

	if (error != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_VALUE, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}